

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O2

visit_behavior __thiscall
dtc::fdt::node::visit
          (node *this,
          function<dtc::fdt::node::visit_behavior_(dtc::fdt::node_&,_dtc::fdt::node_*)> *fn,
          node *parent)

{
  pointer psVar1;
  node *this_00;
  visit_behavior vVar2;
  pointer psVar3;
  function<dtc::fdt::node::visit_behavior_(dtc::fdt::node_&,_dtc::fdt::node_*)> local_50;
  
  vVar2 = std::function<dtc::fdt::node::visit_behavior_(dtc::fdt::node_&,_dtc::fdt::node_*)>::
          operator()(fn,this,parent);
  if (vVar2 == VISIT_CONTINUE) {
LAB_0012d378:
    vVar2 = VISIT_RECURSE;
  }
  else if (vVar2 != VISIT_BREAK) {
    psVar3 = (this->children).
             super__Vector_base<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (this->children).
             super__Vector_base<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (psVar3 == psVar1) goto LAB_0012d378;
      this_00 = (psVar3->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::function<dtc::fdt::node::visit_behavior_(dtc::fdt::node_&,_dtc::fdt::node_*)>::function
                (&local_50,fn);
      vVar2 = visit(this_00,&local_50,this);
      std::_Function_base::~_Function_base(&local_50.super__Function_base);
      psVar3 = psVar3 + 1;
    } while (vVar2 == VISIT_RECURSE);
  }
  return vVar2;
}

Assistant:

node::visit_behavior
node::visit(std::function<visit_behavior(node&, node*)> fn, node *parent)
{
	visit_behavior behavior;
	behavior = fn(*this, parent);
	if (behavior == VISIT_BREAK)
	{
		return VISIT_BREAK;
	}
	else if (behavior != VISIT_CONTINUE)
	{
		for (auto &&c : children)
		{
			behavior = c->visit(fn, this);
			// Any status other than VISIT_RECURSE stops our execution and
			// bubbles up to our caller.  The caller may then either continue
			// visiting nodes that are siblings to this one or completely halt
			// visiting.
			if (behavior != VISIT_RECURSE)
			{
				return behavior;
			}
		}
	}
	// Continue recursion by default
	return VISIT_RECURSE;
}